

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_storage.cpp
# Opt level: O0

void __thiscall duckdb::InMemoryLogStorage::ResetBuffers(InMemoryLogStorage *this)

{
  unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
  *in_RDI;
  ColumnDataCollection *unaff_retaddr;
  DataChunk *in_stack_00000050;
  
  unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
            ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *)in_RDI);
  DataChunk::Reset(in_stack_00000050);
  unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
            ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *)in_RDI);
  DataChunk::Reset(in_stack_00000050);
  unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
  ::operator->(in_RDI);
  ColumnDataCollection::Reset(unaff_retaddr);
  unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
  ::operator->(in_RDI);
  ColumnDataCollection::Reset(unaff_retaddr);
  ::std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::clear((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
           *)0x620ec7);
  return;
}

Assistant:

void InMemoryLogStorage::ResetBuffers() {
	entry_buffer->Reset();
	log_context_buffer->Reset();

	log_entries->Reset();
	log_contexts->Reset();

	registered_contexts.clear();
}